

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  _Bool _Var1;
  uint16_t key;
  uint16_t uVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint8_t *c2_00;
  container_t *pcVar5;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint8_t result_type;
  uint8_t type2;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int length2;
  int length1;
  int intersection_size;
  int pos2;
  int pos1;
  uint8_t *in_stack_ffffffffffffffa8;
  uint16_t x;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar6;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t type2_00;
  uint8_t local_2b;
  uint8_t local_2a;
  uint8_t in_stack_ffffffffffffffd7;
  int local_1c;
  int local_18;
  int local_14;
  
  if (in_RDI != in_RSI) {
    local_14 = 0;
    local_18 = 0;
    local_1c = 0;
    iVar3 = ra_get_size(in_RDI);
    iVar4 = ra_get_size(in_RSI);
    while (uVar6 = local_14 < iVar3 && local_18 < iVar4, local_14 < iVar3 && local_18 < iVar4) {
      key = ra_get_key_at_index(in_RDI,(uint16_t)local_14);
      uVar2 = ra_get_key_at_index(in_RSI,(uint16_t)local_18);
      if (key == uVar2) {
        c2_00 = (uint8_t *)
                ra_get_container_at_index(in_RDI,(uint16_t)local_14,&stack0xffffffffffffffd7);
        pcVar5 = ra_get_container_at_index(in_RSI,(uint16_t)local_18,&local_2a);
        type2_00 = (uint8_t)((ulong)pcVar5 >> 0x38);
        if (in_stack_ffffffffffffffd7 == '\x04') {
          in_stack_ffffffffffffffa8 =
               (uint8_t *)
               container_and((container_t *)CONCAT44(iVar4,CONCAT22(key,uVar2)),'\x04',c2_00,
                             type2_00,in_stack_ffffffffffffffb8);
        }
        else {
          in_stack_ffffffffffffffa8 =
               (uint8_t *)
               container_iand((container_t *)CONCAT44(iVar4,CONCAT22(key,uVar2)),
                              in_stack_ffffffffffffffd7,c2_00,type2_00,in_stack_ffffffffffffffb8);
        }
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffa8;
        if (in_stack_ffffffffffffffa8 != c2_00) {
          container_free((container_t *)CONCAT17(uVar6,in_stack_ffffffffffffffb0),
                         (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
        }
        _Var1 = container_nonzero_cardinality(in_stack_ffffffffffffffa8,'\0');
        if (_Var1) {
          ra_replace_key_and_container_at_index
                    (in_RDI,local_1c,key,in_stack_ffffffffffffffb8,local_2b);
          local_1c = local_1c + 1;
        }
        else {
          container_free((container_t *)CONCAT17(uVar6,in_stack_ffffffffffffffb0),
                         (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
        }
        local_14 = local_14 + 1;
        local_18 = local_18 + 1;
      }
      else {
        x = (uint16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
        if (key < uVar2) {
          local_14 = ra_advance_until_freeing
                               ((roaring_array_t *)CONCAT17(uVar6,in_stack_ffffffffffffffb0),x,
                                (int32_t)in_stack_ffffffffffffffa8);
        }
        else {
          local_18 = ra_advance_until((roaring_array_t *)CONCAT17(uVar6,in_stack_ffffffffffffffb0),x
                                      ,(int32_t)in_stack_ffffffffffffffa8);
        }
      }
    }
    for (; local_14 < iVar3; local_14 = local_14 + 1) {
      container_free((container_t *)CONCAT17(uVar6,in_stack_ffffffffffffffb0),
                     (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
    }
    ra_downsize(in_RDI,local_1c);
  }
  return;
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}